

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::root_path(path *__return_storage_ptr__,path *this)

{
  path local_38;
  
  root_name(__return_storage_ptr__,this);
  root_directory(&local_38,this);
  std::__cxx11::string::~string((string *)&local_38);
  if (local_38.m_pathname._M_string_length != 0) {
    root_directory(&local_38,this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

path  path::root_path() const
  { 
    path temp(root_name());
    if (!root_directory().empty()) temp.m_pathname += root_directory().c_str();
    return temp;
  }